

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_ddd_open_list.hpp
# Opt level: O0

void __thiscall
astar_ddd::AstarDDDOpenList<Node<Tiles>_>::AstarDDDOpenList
          (AstarDDDOpenList<Node<Tiles>_> *this,bool reopen_closed)

{
  uint uVar1;
  size_type __n;
  byte in_SIL;
  uint *in_RDI;
  int i;
  BucketType in_stack_000000b8;
  int in_stack_000000bc;
  AstarDDDOpenList<Node<Tiles>_> *in_stack_000000c0;
  TabulationHash<Node<Tiles>_> *in_stack_00000ee0;
  unique_ptr<named_fstream,_std::default_delete<named_fstream>_> *puVar2;
  unique_ptr<named_fstream,_std::default_delete<named_fstream>_> *this_00;
  allocator_type *in_stack_ffffffffffffff80;
  allocator_type *__a;
  size_type in_stack_ffffffffffffff88;
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  *in_stack_ffffffffffffff90;
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  *this_01;
  char (*args) [35];
  int local_2c;
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  local_1e;
  
  local_1e.
  super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = in_SIL & 1;
  *in_RDI = 10;
  *(byte *)(in_RDI + 1) =
       local_1e.
       super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_;
  in_RDI[2] = 0;
  uVar1 = std::numeric_limits<int>::max();
  in_RDI[3] = uVar1;
  *(undefined1 *)(in_RDI + 4) = 1;
  in_RDI[5] = 0;
  args = (char (*) [35])
         ((long)&local_1e.
                 super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>::allocator
            ((allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_> *)
             0x1273c2);
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::vector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>::~allocator
            ((allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_> *)
             0x1273e5);
  std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>::allocator
            ((allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_> *)
             0x12740d);
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::vector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>::~allocator
            ((allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_> *)
             0x12742d);
  __a = (allocator_type *)(in_RDI + 0x12);
  __n = (size_type)(int)*in_RDI;
  this_01 = &local_1e;
  std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>::allocator
            ((allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_> *)
             0x127455);
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::vector(this_01,__n,__a);
  std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>::~allocator
            ((allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_> *)
             0x127475);
  this_00 = (unique_ptr<named_fstream,_std::default_delete<named_fstream>_> *)(in_RDI + 0x18);
  std::unique_ptr<named_fstream,std::default_delete<named_fstream>>::
  unique_ptr<std::default_delete<named_fstream>,void>(this_00);
  TabulationHash<Node<Tiles>_>::TabulationHash(in_stack_00000ee0);
  puVar2 = (unique_ptr<named_fstream,_std::default_delete<named_fstream>_> *)(in_RDI + 0x20);
  TabulationHash<Node<Tiles>_>::TabulationHash(in_stack_00000ee0);
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  mkdir("open_list_buckets",0x1e4);
  memory::make_unique<named_fstream,char_const(&)[35]>(args);
  std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>::operator=(this_00,puVar2);
  std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>::~unique_ptr(this_00);
  for (local_2c = 0; local_2c < (int)*in_RDI; local_2c = local_2c + 1) {
    create_bucket(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8);
    create_bucket(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8);
    create_bucket(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8);
  }
  dfpair(_stdout,"number of hash buckets","%d",(ulong)*in_RDI);
  return;
}

Assistant:

AstarDDDOpenList<Entry>::AstarDDDOpenList(bool reopen_closed) :
        reopen_closed(reopen_closed),
        open_buckets(n_buckets),
        next_buckets(n_buckets),
        closed_buckets(n_buckets)
    {
        // create directory for open list files if not exist
        mkdir("open_list_buckets", 0744);
        
        recursive_bucket = memory::make_unique<named_fstream>
            ("open_list_buckets/recursive.bucket");

        // create buckets
        for (int i = 0; i < n_buckets; ++i) {
            create_bucket(i, BucketType::open);
            create_bucket(i, BucketType::next);
            create_bucket(i, BucketType::closed);
        }
        dfpair(stdout, "number of hash buckets", "%d", n_buckets);
    }